

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartList.cpp
# Opt level: O2

void __thiscall PartList::Draw(PartList *this,char *title,bool *p_open,Board *board)

{
  KeyBindings *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ImGuiListClipper clipper;
  ImVec2 local_70;
  SharedVector<Component> parts;
  string part_name;
  
  clipper.Ctx = (ImGuiContext *)0x4420000043c80000;
  ImGui::SetNextWindowSize((ImVec2 *)&clipper,0);
  ImGui::Begin(title,p_open,0);
  ImGui::Columns(1,"part_infos",true);
  ImGui::Separator();
  ImGui::Text("Name");
  ImGui::NextColumn();
  ImGui::Separator();
  if (board != (Board *)0x0) {
    iVar2 = (*board->_vptr_Board[3])(board);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
              (&parts,(vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&part_name,"",(allocator<char> *)&clipper);
    ImGuiListClipper::ImGuiListClipper(&clipper);
    ImGuiListClipper::Begin
              (&clipper,(int)((ulong)((long)parts.
                                            super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)parts.
                                           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4),-1.0);
    while( true ) {
      bVar1 = ImGuiListClipper::Step(&clipper);
      if (!bVar1) break;
      for (lVar3 = (long)clipper.DisplayStart; lVar3 < clipper.DisplayEnd; lVar3 = lVar3 + 1) {
        std::__cxx11::string::_M_assign((string *)&part_name);
        local_70.x = 0.0;
        local_70.y = 0.0;
        bVar1 = ImGui::Selectable(part_name._M_dataplus._M_p,(int)lVar3 == Draw::selected,4,
                                  &local_70);
        if (bVar1) {
          Draw::selected = (int)lVar3;
          bVar1 = ImGui::IsMouseDoubleClicked(0);
          if (bVar1) {
            std::function<void_(const_char_*)>::operator()
                      (&this->cbNetSelected_,part_name._M_dataplus._M_p);
          }
        }
        ImGui::NextColumn();
      }
    }
    ImGuiListClipper::End(&clipper);
    ImGuiListClipper::~ImGuiListClipper(&clipper);
    std::__cxx11::string::~string((string *)&part_name);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (&parts);
  }
  ImGui::Columns(1,(char *)0x0,true);
  ImGui::Separator();
  bVar1 = ImGui::IsWindowHovered(0);
  if (bVar1) {
    this_00 = this->keyBindings;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&clipper,"CloseDialog",(allocator<char> *)&part_name);
    bVar1 = KeyBindings::isPressed(this_00,(string *)&clipper);
    std::__cxx11::string::~string((string *)&clipper);
    if (bVar1) {
      *p_open = false;
    }
  }
  ImGui::End();
  return;
}

Assistant:

void PartList::Draw(const char *title, bool *p_open, Board *board) {
	// TODO: export / fix dimensions & behaviour
	int width  = 400;
	int height = 640;

	ImGui::SetNextWindowSize(ImVec2(width, height));
	ImGui::Begin(title, p_open);

	ImGui::Columns(1, "part_infos");
	ImGui::Separator();

	ImGui::Text("Name");
	ImGui::NextColumn();
	ImGui::Separator();

	if (board) {
		auto parts = board->Components();

		static int selected = -1;
		std::string part_name    = "";
		ImGuiListClipper clipper;
		clipper.Begin(parts.size());
		while (clipper.Step()) {
			for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++) {
				part_name = parts[i]->name;

				if (ImGui::Selectable(part_name.c_str(), selected == i, ImGuiSelectableFlags_AllowDoubleClick)) {
					selected = i;
					if (ImGui::IsMouseDoubleClicked(0)) {
						cbNetSelected_(part_name.c_str());
					}
				}
				ImGui::NextColumn();
			}
		}
		clipper.End();
	}
	ImGui::Columns(1);
	ImGui::Separator();

	if (ImGui::IsWindowHovered() && keyBindings.isPressed("CloseDialog")) {
		*p_open = false;
	}

	ImGui::End();
}